

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

void Gia_ManSortUnatesInt
               (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
               Vec_Int_t *vUnateLitsW,Vec_Wec_t *vSorter)

{
  uint Entry;
  bool bVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  size_t __size;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  
  iVar10 = (int)((long)nWords * 0x40);
  if (vSorter->nCap < iVar10) {
    if (vSorter->pArray == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)iVar10 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(vSorter->pArray,(long)iVar10 << 4);
    }
    vSorter->pArray = pVVar3;
    memset(pVVar3 + vSorter->nCap,0,((long)nWords * 0x40 - (long)vSorter->nCap) * 0x10);
    vSorter->nCap = iVar10;
  }
  vSorter->nSize = iVar10;
  if (0 < vUnateLits->nSize) {
    lVar9 = 0;
    do {
      Entry = vUnateLits->pArray[lVar9];
      if ((int)Entry < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (vDivs->nSize <= (int)(Entry >> 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((Entry & 1) == 0) {
        if (nWords < 1) {
LAB_007948a5:
          uVar11 = 0;
        }
        else {
          uVar4 = 0;
          uVar11 = 0;
          do {
            uVar6 = *(ulong *)((long)vDivs->pArray[Entry >> 1] + uVar4 * 8) & pOn[uVar4];
            uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
            uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
            uVar6 = (uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f;
            uVar6 = (uVar6 >> 8) + uVar6;
            lVar8 = (uVar6 >> 0x10) + uVar6;
            uVar11 = (ulong)((int)uVar11 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU));
            uVar4 = uVar4 + 1;
          } while ((uint)nWords != uVar4);
        }
      }
      else {
        if (nWords < 1) goto LAB_007948a5;
        uVar4 = 0;
        uVar11 = 0;
        do {
          uVar6 = ~*(ulong *)((long)vDivs->pArray[Entry >> 1] + uVar4 * 8) & pOn[uVar4];
          uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
          uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
          uVar6 = (uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f;
          uVar6 = (uVar6 >> 8) + uVar6;
          lVar8 = (uVar6 >> 0x10) + uVar6;
          uVar11 = (ulong)((int)uVar11 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU));
          uVar4 = uVar4 + 1;
        } while ((uint)nWords != uVar4);
      }
      iVar10 = (int)uVar11;
      if (vSorter->nSize <= iVar10) {
        iVar5 = iVar10 + 1;
        iVar2 = vSorter->nSize * 2;
        if (iVar2 <= iVar5) {
          iVar2 = iVar5;
        }
        if (vSorter->nCap < iVar2) {
          __size = (long)iVar2 << 4;
          if (vSorter->pArray == (Vec_Int_t *)0x0) {
            pVVar3 = (Vec_Int_t *)malloc(__size);
          }
          else {
            pVVar3 = (Vec_Int_t *)realloc(vSorter->pArray,__size);
          }
          vSorter->pArray = pVVar3;
          memset(pVVar3 + vSorter->nCap,0,((long)iVar2 - (long)vSorter->nCap) * 0x10);
          vSorter->nCap = iVar2;
        }
        vSorter->nSize = iVar5;
      }
      if ((iVar10 < 0) || (vSorter->nSize <= iVar10)) goto LAB_00794a2d;
      Vec_IntPush(vSorter->pArray + uVar11,Entry);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vUnateLits->nSize);
  }
  vUnateLits->nSize = 0;
  vUnateLitsW->nSize = 0;
  lVar9 = (long)vSorter->nSize;
  if (0 < (long)vSorter->nSize) {
    do {
      if (vSorter->nSize < lVar9) {
LAB_00794a2d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar8 = lVar9 + -1;
      pVVar3 = vSorter->pArray;
      if (0 < pVVar3[lVar8].nSize) {
        lVar7 = 0;
        do {
          Vec_IntPush(vUnateLits,pVVar3[lVar8].pArray[lVar7]);
          Vec_IntPush(vUnateLitsW,(int)lVar8);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar3[lVar8].nSize);
      }
      bVar1 = 1 < lVar9;
      lVar9 = lVar8;
    } while (bVar1);
  }
  iVar10 = vSorter->nSize;
  if (0 < (long)iVar10) {
    pVVar3 = vSorter->pArray;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)&pVVar3->nSize + lVar9) = 0;
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar10 * 0x10 != lVar9);
  }
  vSorter->nSize = 0;
  return;
}

Assistant:

void Gia_ManSortUnatesInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnateLitsW, Vec_Wec_t * vSorter )
{
    int i, k, iLit;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnateLits, iLit, i )
    {
        word * pDiv = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iLit));
        //assert( !Abc_TtIntersectOne( pOff, 0, pDiv, Abc_LitIsCompl(iLit), nWords ) );
        Vec_WecPush( vSorter, Abc_TtCountOnesVecMask(pDiv, pOn, nWords, Abc_LitIsCompl(iLit)), iLit );
    }
    Vec_IntClear( vUnateLits );
    Vec_IntClear( vUnateLitsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iLit, i )
        {
            Vec_IntPush( vUnateLits, iLit );
            Vec_IntPush( vUnateLitsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );
}